

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O2

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::enqueue
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          *clients,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                   *client,milliseconds collect_time)

{
  uint pool_size;
  size_t sVar1;
  milliseconds sleep_time;
  bool bVar2;
  type local_41;
  undefined1 local_40 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  sVar1 = coro_io::detail::
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          ::enqueue(clients,client);
  if (sVar1 == 1) {
    LOCK();
    bVar2 = (clients->collecter_cnt_).super___atomic_base<unsigned_long>._M_i == 0;
    if (bVar2) {
      (clients->collecter_cnt_).super___atomic_base<unsigned_long>._M_i = 1;
    }
    UNLOCK();
    if (bVar2) {
      std::
      __weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
      ::__weak_ptr((__weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_40 + 0x10),
                   (__weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
                    *)this);
      sleep_time.__r = 0x32;
      if (0x32 < collect_time.__r) {
        sleep_time.__r = collect_time.__r;
      }
      collect_idle_timeout_client
                ((client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *)local_40,
                 (weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *)(local_40 + 0x10),clients,sleep_time,
                 (ulong)(this->pool_config_).idle_queue_per_max_clear_count);
      pool_size = std::thread::hardware_concurrency();
      get_global_executor<coro_io::io_context_pool>(pool_size);
      async_simple::coro::Lazy<void>::via((Lazy<void> *)(local_40 + 8),(Executor *)local_40);
      async_simple::coro::detail::LazyBase<void,_true>::
      start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_client_pool_hpp:262:20)>
                ((LazyBase<void,_true> *)(local_40 + 8),&local_41);
      async_simple::coro::detail::LazyBase<void,_true>::~LazyBase
                ((LazyBase<void,_true> *)(local_40 + 8));
      async_simple::coro::detail::LazyBase<void,_false>::~LazyBase
                ((LazyBase<void,_false> *)local_40);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
    }
  }
  return;
}

Assistant:

void enqueue(
      coro_io::detail::client_queue<std::unique_ptr<client_t>>& clients,
      std::unique_ptr<client_t> client,
      std::chrono::milliseconds collect_time) {
    if (clients.enqueue(std::move(client)) == 1) {
      std::size_t expected = 0;
      if (clients.collecter_cnt_.compare_exchange_strong(expected, 1)) {
        CINATRA_LOG_TRACE << "start timeout client collecter of client_pool{"
                          << host_name_ << "}";
        collect_idle_timeout_client(
            this->weak_from_this(), clients,
            (std::max)(collect_time, std::chrono::milliseconds{50}),
            pool_config_.idle_queue_per_max_clear_count)
            .via(coro_io::get_global_executor())
            .start([](auto&&) {
            });
      }
    }
  }